

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::MultiContextRenderTests::addClearActions(MultiContextRenderTests *this)

{
  ModifyRenderbufferClearColor *this_00;
  ModifyRenderbufferClearDepth *this_01;
  ModifyRenderbufferClearStencil *this_02;
  DefaultDeleter<deqp::egl::Image::Action> local_e9;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_e8;
  allocator<char> local_d1;
  string local_d0;
  DefaultDeleter<deqp::egl::Image::Action> local_a9;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_a8;
  allocator<char> local_91;
  string local_90;
  DefaultDeleter<deqp::egl::Image::Action> local_69;
  Vector<float,_4> local_68;
  MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_58 [2];
  allocator<char> local_31;
  string local_30;
  MultiContextRenderTests *local_10;
  MultiContextRenderTests *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"renderbuffer_clear_color",&local_31);
  this_00 = (ModifyRenderbufferClearColor *)operator_new(0x18);
  tcu::Vector<float,_4>::Vector(&local_68,0.8,0.2,0.9,1.0);
  GLES2ImageApi::ModifyRenderbufferClearColor::ModifyRenderbufferClearColor(this_00,&local_68);
  de::DefaultDeleter<deqp::egl::Image::Action>::DefaultDeleter(&local_69);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  MovePtr(local_58,this_00);
  LabeledActions::add(&this->m_clearActions,&local_30,local_58);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~MovePtr(local_58);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"renderbuffer_clear_depth",&local_91);
  this_01 = (ModifyRenderbufferClearDepth *)operator_new(0x10);
  GLES2ImageApi::ModifyRenderbufferClearDepth::ModifyRenderbufferClearDepth(this_01,0.75);
  de::DefaultDeleter<deqp::egl::Image::Action>::DefaultDeleter(&local_a9);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  MovePtr(&local_a8,this_01);
  LabeledActions::add(&this->m_clearActions,&local_90,&local_a8);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~MovePtr(&local_a8);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"renderbuffer_clear_stencil",&local_d1);
  this_02 = (ModifyRenderbufferClearStencil *)operator_new(0x10);
  GLES2ImageApi::ModifyRenderbufferClearStencil::ModifyRenderbufferClearStencil(this_02,0x61);
  de::DefaultDeleter<deqp::egl::Image::Action>::DefaultDeleter(&local_e9);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  MovePtr(&local_e8,this_02);
  LabeledActions::add(&this->m_clearActions,&local_d0,&local_e8);
  de::details::MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~MovePtr(&local_e8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  return;
}

Assistant:

void MultiContextRenderTests::addClearActions (void)
{
	m_clearActions.add("renderbuffer_clear_color",		MovePtr<Action>(new GLES2ImageApi::ModifyRenderbufferClearColor(tcu::Vec4(0.8f, 0.2f, 0.9f, 1.0f))));
	m_clearActions.add("renderbuffer_clear_depth",		MovePtr<Action>(new GLES2ImageApi::ModifyRenderbufferClearDepth(0.75f)));
	m_clearActions.add("renderbuffer_clear_stencil",	MovePtr<Action>(new GLES2ImageApi::ModifyRenderbufferClearStencil(97)));
}